

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtVector3.h
# Opt level: O3

void cbtNearestPointInLineSegment
               (cbtVector3 *point,cbtVector3 *line0,cbtVector3 *line1,cbtVector3 *nearestPoint)

{
  float fVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  float fVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)line1->m_floats;
  uVar2 = *(ulong *)line0->m_floats;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar2;
  fVar1 = line0->m_floats[2];
  auVar3 = vsubps_avx(auVar8,auVar6);
  fVar4 = line1->m_floats[2] - fVar1;
  auVar8 = vmovshdup_avx(auVar3);
  fVar9 = auVar8._0_4_;
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar9 * fVar9)),auVar3,auVar3);
  auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar4),ZEXT416((uint)fVar4));
  if (auVar8._0_4_ < 1.4210855e-14) {
    uVar5 = *(undefined8 *)(line0->m_floats + 2);
    *(undefined8 *)nearestPoint->m_floats = *(undefined8 *)line0->m_floats;
    *(undefined8 *)(nearestPoint->m_floats + 2) = uVar5;
    return;
  }
  auVar6 = vmovshdup_avx(auVar6);
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar9 * (point->m_floats[1] - auVar6._0_4_))),auVar3,
                           ZEXT416((uint)(point->m_floats[0] - (float)uVar2)));
  auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)fVar4),ZEXT416((uint)(point->m_floats[2] - fVar1)));
  fVar10 = auVar6._0_4_ / auVar8._0_4_;
  fVar9 = 0.0;
  if ((0.0 <= fVar10) && (fVar9 = fVar10, 1.0 < fVar10)) {
    fVar9 = 1.0;
  }
  auVar7._0_4_ = (float)uVar2 + auVar3._0_4_ * fVar9;
  auVar7._4_4_ = (float)(uVar2 >> 0x20) + auVar3._4_4_ * fVar9;
  auVar7._8_4_ = auVar3._8_4_ * fVar9 + 0.0;
  auVar7._12_4_ = auVar3._12_4_ * fVar9 + 0.0;
  auVar8 = vinsertps_avx(auVar7,ZEXT416((uint)(fVar1 + fVar4 * fVar9)),0x28);
  *(undefined1 (*) [16])nearestPoint->m_floats = auVar8;
  return;
}

Assistant:

SIMD_FORCE_INLINE cbtVector3
operator-(const cbtVector3& v1, const cbtVector3& v2)
{
#if defined BT_USE_SIMD_VECTOR3 && (defined(BT_USE_SSE_IN_API) && defined(BT_USE_SSE))

	//	without _mm_and_ps this code causes slowdown in Concave moving
	__m128 r = _mm_sub_ps(v1.mVec128, v2.mVec128);
	return cbtVector3(_mm_and_ps(r, btvFFF0fMask));
#elif defined(BT_USE_NEON)
	float32x4_t r = vsubq_f32(v1.mVec128, v2.mVec128);
	return cbtVector3((float32x4_t)vandq_s32((int32x4_t)r, btvFFF0Mask));
#else
	return cbtVector3(
		v1.m_floats[0] - v2.m_floats[0],
		v1.m_floats[1] - v2.m_floats[1],
		v1.m_floats[2] - v2.m_floats[2]);
#endif
}